

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProString::endsWith(ProString *this,QString *sub,CaseSensitivity cs)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView s;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_data = (this->m_string).d.ptr;
  local_30.m_size = (this->m_string).d.size;
  local_30 = QStringView::mid(&local_30,(long)this->m_offset,(long)this->m_length);
  s.m_data = (sub->d).ptr;
  s.m_size = (sub->d).size;
  bVar1 = QStringView::endsWith(&local_30,s,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const QString &sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().endsWith(sub, cs); }